

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::applyOncePragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  flat_hash_set<const_char_*> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  SourceManager *this_00;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  SourceLocation SVar7;
  ulong pos0;
  value_type *elements;
  ulong hash;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  string_view sVar17;
  locator res;
  char *local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  ensurePragmaArgs(this,pragma,0);
  this_00 = this->sourceManager;
  SVar7 = Token::location(&(pragma->super_DirectiveSyntax).directive);
  sVar17 = SourceManager::getSourceText(this_00,(BufferID)(SVar7._0_4_ & 0xfffffff));
  local_60 = sVar17._M_str;
  if (sVar17._M_len != 0) {
    arrays_ = &this->includeOnceHeaders;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_60;
    hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->includeOnceHeaders).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                          .arrays.groups_size_index & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    uVar4 = (this->includeOnceHeaders).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
            .arrays.groups_size_mask;
    uVar8 = 0;
    uVar11 = pos0;
    do {
      pgVar2 = (this->includeOnceHeaders).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
               .arrays.groups_ + uVar11;
      local_58 = pgVar2->m[0].n;
      uStack_57 = pgVar2->m[1].n;
      uStack_56 = pgVar2->m[2].n;
      bStack_55 = pgVar2->m[3].n;
      uStack_54 = pgVar2->m[4].n;
      uStack_53 = pgVar2->m[5].n;
      uStack_52 = pgVar2->m[6].n;
      bStack_51 = pgVar2->m[7].n;
      uStack_50 = pgVar2->m[8].n;
      uStack_4f = pgVar2->m[9].n;
      uStack_4e = pgVar2->m[10].n;
      bStack_4d = pgVar2->m[0xb].n;
      uStack_4c = pgVar2->m[0xc].n;
      uStack_4b = pgVar2->m[0xd].n;
      uStack_4a = pgVar2->m[0xe].n;
      bStack_49 = pgVar2->m[0xf].n;
      uVar12 = (uchar)uVar3;
      auVar16[0] = -(local_58 == uVar12);
      uVar13 = (uchar)((uint)uVar3 >> 8);
      auVar16[1] = -(uStack_57 == uVar13);
      uVar14 = (uchar)((uint)uVar3 >> 0x10);
      auVar16[2] = -(uStack_56 == uVar14);
      bVar15 = (byte)((uint)uVar3 >> 0x18);
      auVar16[3] = -(bStack_55 == bVar15);
      auVar16[4] = -(uStack_54 == uVar12);
      auVar16[5] = -(uStack_53 == uVar13);
      auVar16[6] = -(uStack_52 == uVar14);
      auVar16[7] = -(bStack_51 == bVar15);
      auVar16[8] = -(uStack_50 == uVar12);
      auVar16[9] = -(uStack_4f == uVar13);
      auVar16[10] = -(uStack_4e == uVar14);
      auVar16[0xb] = -(bStack_4d == bVar15);
      auVar16[0xc] = -(uStack_4c == uVar12);
      auVar16[0xd] = -(uStack_4b == uVar13);
      auVar16[0xe] = -(uStack_4a == uVar14);
      auVar16[0xf] = -(bStack_49 == bVar15);
      for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
          uVar9 = uVar9 - 1 & uVar9) {
        uVar5 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        if (local_60 ==
            (this->includeOnceHeaders).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
            .arrays.elements_[uVar11 * 0xf + (ulong)uVar5]) {
          return;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
      lVar10 = uVar11 + uVar8;
      uVar8 = uVar8 + 1;
      uVar11 = lVar10 + 1U & uVar4;
    } while (uVar8 <= uVar4);
    if ((this->includeOnceHeaders).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
        .size_ctrl.size <
        (this->includeOnceHeaders).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
      ::nosize_unchecked_emplace_at<char_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
                  *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_60);
      psVar1 = &(this->includeOnceHeaders).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
      ::unchecked_emplace_with_rehash<char_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
                  *)arrays_,hash,&local_60);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyOncePragma(const PragmaDirectiveSyntax& pragma) {
    ensurePragmaArgs(pragma, 0);

    auto text = sourceManager.getSourceText(pragma.directive.location().buffer());
    if (!text.empty())
        includeOnceHeaders.emplace(text.data());
}